

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3SegReaderTermCmp(Fts3SegReader *pSeg,char *zTerm,int nTerm)

{
  int iVar1;
  int iVar2;
  
  if (pSeg->aNode == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = pSeg->nTerm;
    iVar1 = nTerm;
    if (iVar2 < nTerm) {
      iVar1 = iVar2;
    }
    iVar1 = memcmp(pSeg->zTerm,zTerm,(long)iVar1);
    iVar2 = iVar2 - nTerm;
    if (iVar1 != 0) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

static int fts3SegReaderTermCmp(
  Fts3SegReader *pSeg,            /* Segment reader object */
  const char *zTerm,              /* Term to compare to */
  int nTerm                       /* Size of term zTerm in bytes */
){
  int res = 0;
  if( pSeg->aNode ){
    if( pSeg->nTerm>nTerm ){
      res = memcmp(pSeg->zTerm, zTerm, nTerm);
    }else{
      res = memcmp(pSeg->zTerm, zTerm, pSeg->nTerm);
    }
    if( res==0 ){
      res = pSeg->nTerm-nTerm;
    }
  }
  return res;
}